

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O3

int state_align_search_finish(ps_search_t *search)

{
  int iVar1;
  bool bVar2;
  ps_alignment_iter_t *ppVar3;
  ps_alignment_entry_t *ppVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int pos;
  uint uVar8;
  uint uVar9;
  int local_40;
  
  lVar5 = (long)*(int *)&search[1].acmod * 0x58;
  iVar7 = *(int *)(search[1].name + lVar5 + -0x24);
  if (iVar7 == -1) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
            ,0xe4,"Failed to reach final state in alignment\n");
LAB_00111bdf:
    iVar7 = -1;
  }
  else {
    local_40 = *(int *)(search[1].name + lVar5 + -0x28);
    ppVar3 = ps_alignment_states((ps_alignment_t *)search[1].type);
    uVar8 = *(uint *)((long)&search[1].acmod + 4);
    uVar9 = uVar8 + 1;
    if (0 < (int)uVar8) {
      iVar6 = -uVar8;
      pos = iVar7;
      do {
        lVar5 = (long)(int)(*(int *)((long)&search[1].dict + 4) * (uVar8 - 1) + iVar7);
        iVar7 = (&(search[1].d2p)->refcount)[lVar5 * 2];
        if (iVar7 == -1) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                  ,0xec,"Alignment failed in frame %d\n",(ulong)(uVar8 - 1));
          goto LAB_00111bdf;
        }
        if (iVar7 != pos) {
          iVar1 = *(int *)(&(search[1].d2p)->field_0x4 + lVar5 * 8);
          ppVar3 = ps_alignment_iter_goto(ppVar3,pos);
          if (ppVar3 == (ps_alignment_iter_t *)0x0) {
            __assert_fail("itor != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                          ,0xf2,"int state_align_search_finish(ps_search_t *)");
          }
          ppVar4 = ps_alignment_iter_get(ppVar3);
          ppVar4->start = uVar8;
          ppVar4->duration = uVar9 + iVar6;
          ppVar4->score = local_40 - iVar1;
          uVar9 = uVar8;
          pos = iVar7;
          local_40 = iVar1;
        }
        iVar6 = iVar6 + 1;
        bVar2 = 1 < uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar2);
    }
    iVar7 = 0;
    ppVar3 = ps_alignment_iter_goto(ppVar3,0);
    if (ppVar3 == (ps_alignment_iter_t *)0x0) {
      __assert_fail("itor != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                    ,0xff,"int state_align_search_finish(ps_search_t *)");
    }
    ppVar4 = ps_alignment_iter_get(ppVar3);
    ppVar4->start = 0;
    ppVar4->duration = uVar9;
    ps_alignment_iter_free(ppVar3);
    ps_alignment_propagate((ps_alignment_t *)search[1].type);
  }
  return iVar7;
}

Assistant:

static int
state_align_search_finish(ps_search_t *search)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    hmm_t *final_phone = sas->hmms + sas->n_phones - 1;
    ps_alignment_iter_t *itor;
    ps_alignment_entry_t *ent;

    int last_frame, cur_frame;
    state_align_hist_t last, cur;

    /* Best state exiting the last cur_frame. */
    last.id = cur.id = hmm_out_history(final_phone);
    last.score = hmm_out_score(final_phone);
    if (last.id == -1) {
        E_ERROR("Failed to reach final state in alignment\n");
        return -1;
    }
    itor = ps_alignment_states(sas->al);
    last_frame = sas->frame + 1;
    for (cur_frame = sas->frame - 1; cur_frame >= 0; --cur_frame) {
	cur = sas->tokens[cur_frame * sas->n_emit_state + cur.id];
        if (cur.id == -1) {
            E_ERROR("Alignment failed in frame %d\n", cur_frame);
            return -1;
        }
        /* State boundary, update alignment entry for next state. */
        if (cur.id != last.id) {
            itor = ps_alignment_iter_goto(itor, last.id);
            assert(itor != NULL);
            ent = ps_alignment_iter_get(itor);
            ent->start = cur_frame + 1;
            ent->duration = last_frame - ent->start;
            ent->score =  last.score - cur.score;
            E_DEBUG("state %d start %d end %d\n", last.id,
                    ent->start, last_frame);
    	    last = cur;
            last_frame = cur_frame + 1;
        }
    }
    /* Update alignment entry for initial state. */
    itor = ps_alignment_iter_goto(itor, 0);
    assert(itor != NULL);
    ent = ps_alignment_iter_get(itor);
    ent->start = 0;
    ent->duration = last_frame;
    E_DEBUG("state %d start %d end %d\n", 0,
            ent->start, last_frame);
    ps_alignment_iter_free(itor);
    ps_alignment_propagate(sas->al);

    return 0;
}